

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLinearSolvers.cpp
# Opt level: O3

void __thiscall
TasGrid::TasSparse::WaveletBasisMatrix::apply<false>(WaveletBasisMatrix *this,double *x,double *r)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  pointer piVar4;
  pointer pdVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  iVar1 = this->num_rows;
  if (0 < (long)iVar1) {
    piVar3 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->vals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    iVar6 = *piVar3;
    do {
      iVar2 = piVar3[lVar8 + 1];
      dVar9 = 0.0;
      if (iVar6 < iVar2) {
        lVar7 = (long)iVar6;
        do {
          dVar9 = dVar9 + pdVar5[lVar7] * x[piVar4[lVar7]];
          lVar7 = lVar7 + 1;
        } while (iVar2 != lVar7);
      }
      r[lVar8] = dVar9;
      lVar8 = lVar8 + 1;
      iVar6 = iVar2;
    } while (lVar8 != iVar1);
  }
  return;
}

Assistant:

void WaveletBasisMatrix::apply(double const x[], double r[]) const{
    if (transpose){
        std::fill_n(r, num_rows, 0.0);
        for(int i=0; i<num_rows; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++)
                r[indx[j]] += vals[j] * x[i];
        }
    }else{
        for(int i=0; i<num_rows; i++){
            double sum = 0.0;
            for(int j=pntr[i]; j<pntr[i+1]; j++)
                sum += vals[j] * x[indx[j]];
            r[i] = sum;
        }
    }
}